

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

sysbvm_tuple_t sysbvm_tuple_asString(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  sysbvm_tuple_t sVar1;
  ulong immediateTypeTag;
  sysbvm_tuple_t local_18;
  
  immediateTypeTag = tuple & 0xf;
  if (immediateTypeTag == 0 && tuple != 0) {
    sVar1 = *(sysbvm_tuple_t *)tuple;
  }
  else if ((int)immediateTypeTag == 0xf) {
    sVar1 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,tuple >> 4);
  }
  else {
    sVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
  }
  if (sVar1 != (context->roots).stringType) {
    sVar1 = sysbvm_type_getAsStringFunction(context,sVar1);
    if (sVar1 == 0) {
      sVar1 = sysbvm_tuple_printString(context,tuple);
      return sVar1;
    }
    local_18 = tuple;
    tuple = sysbvm_function_apply(context,sVar1,1,&local_18,0);
  }
  return tuple;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_asString(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type == context->roots.stringType)
        return tuple;
    sysbvm_tuple_t asStringFunction = sysbvm_type_getAsStringFunction(context, type);
    if(asStringFunction == SYSBVM_NULL_TUPLE)
        return sysbvm_tuple_defaultAsString(context, tuple);
    return sysbvm_function_apply1(context, asStringFunction, tuple);
}